

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void __thiscall
bk_lib::pod_vector<Clasp::DomainTable::ValueType,_std::allocator<Clasp::DomainTable::ValueType>_>::
pod_vector(pod_vector<Clasp::DomainTable::ValueType,_std::allocator<Clasp::DomainTable::ValueType>_>
           *this,pod_vector<Clasp::DomainTable::ValueType,_std::allocator<Clasp::DomainTable::ValueType>_>
                 *other)

{
  size_type sVar1;
  const_iterator __src;
  pod_vector<Clasp::DomainTable::ValueType,_std::allocator<Clasp::DomainTable::ValueType>_> *in_RSI;
  allocator<Clasp::DomainTable::ValueType> *in_RDI;
  const_pointer buf;
  pod_vector<Clasp::DomainTable::ValueType,_std::allocator<Clasp::DomainTable::ValueType>_>
  *in_stack_ffffffffffffff98;
  void *__dest;
  allocator<Clasp::DomainTable::ValueType> *paVar2;
  undefined4 in_stack_ffffffffffffffc0;
  size_type n;
  
  paVar2 = in_RDI;
  sVar1 = size(in_RSI);
  n = (size_type)((ulong)paVar2 >> 0x20);
  get_allocator(in_stack_ffffffffffffff98);
  ebo::ebo((ebo *)CONCAT44(sVar1,in_stack_ffffffffffffffc0),n,in_RDI);
  std::allocator<Clasp::DomainTable::ValueType>::~allocator
            ((allocator<Clasp::DomainTable::ValueType> *)0x1d8dde);
  __src = begin(in_RSI);
  if (__src != (const_iterator)0x0) {
    __dest = *(void **)in_RDI;
    sVar1 = size(in_RSI);
    memcpy(__dest,__src,(ulong)sVar1 * 0xc);
  }
  sVar1 = size(in_RSI);
  *(size_type *)(in_RDI + 8) = sVar1;
  return;
}

Assistant:

pod_vector(const pod_vector& other) : ebo_(other.size(), other.get_allocator()) {
		if (const_pointer buf = other.begin()) {
			std::memcpy(ebo_.buf, buf, other.size()*sizeof(T));
		}
		ebo_.size = other.size();
	}